

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.c
# Opt level: O0

token * comma_expression(dmr_C *C,token *token,expression **tree)

{
  token *C_00;
  expression *peVar1;
  char *pcVar2;
  expression *peStack_40;
  int op;
  expression *right;
  expression *top;
  token *next;
  expression *left;
  expression **tree_local;
  token *token_local;
  dmr_C *C_local;
  
  next = (token *)0x0;
  left = (expression *)tree;
  tree_local = (expression **)token;
  token_local = (token *)C;
  top = (expression *)dmrC_assignment_expression(C,token,(expression **)&next);
  if (next != (token *)0x0) {
    while( true ) {
      if ((((uint)*(undefined8 *)top & 0x3f) != 0x11) ||
         (peStack_40 = (expression *)0x0, *(int *)&top->ctype != 0x2c)) goto LAB_0010cb64;
      right = dmrC_alloc_expression((dmr_C *)token_local,*(position *)top,0x15);
      peVar1 = (expression *)
               dmrC_assignment_expression
                         ((dmr_C *)token_local,(token *)top->pos,&stack0xffffffffffffffc0);
      C_00 = token_local;
      top = peVar1;
      if (peStack_40 == (expression *)0x0) break;
      *(ushort *)right =
           *(ushort *)right & 0xff | ((*(ushort *)&next->pos & *(ushort *)peStack_40) >> 8 & 1) << 8
      ;
      right->op = 0x2c;
      (right->field_5).field_3.unop = (expression *)next;
      (right->field_5).field_2.string = (string *)peStack_40;
      next = (token *)right;
    }
    pcVar2 = dmrC_show_special((dmr_C *)token_local,0x2c);
    dmrC_sparse_error((dmr_C *)C_00,*(position *)peVar1,"No right hand side of \'%s\'-expression",
                      pcVar2);
  }
LAB_0010cb64:
  *(token **)left = next;
  return (token *)top;
}

Assistant:

static struct token *comma_expression(struct dmr_C *C, struct token *token, struct expression **tree)
{
	LR_BINOP_EXPRESSION(C,
		token, tree, EXPR_COMMA, dmrC_assignment_expression,
		(op == ',')
	);
}